

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writeModelBoundSolution
               (FILE *file,HighsLogOptions *log_options,bool columns,HighsInt dim,
               vector<double,_std::allocator<double>_> *lower,
               vector<double,_std::allocator<double>_> *upper,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,bool have_primal,vector<double,_std::allocator<double>_> *primal,
               bool have_dual,vector<double,_std::allocator<double>_> *dual,bool have_basis,
               vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
               HighsVarType *integrality)

{
  uint uVar1;
  size_type sVar2;
  char *pcVar3;
  const_reference pvVar4;
  undefined8 uVar5;
  int in_ECX;
  byte in_DL;
  string *in_RSI;
  double in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  byte in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  byte in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  byte in_stack_00000030;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_00000038;
  long in_stack_00000040;
  string var_status_string;
  HighsInt ix;
  string s;
  stringstream ss;
  bool have_integrality;
  bool have_names;
  string *in_stack_fffffffffffffc00;
  string *s_00;
  HighsLogOptions *in_stack_fffffffffffffc08;
  FILE *in_stack_fffffffffffffc10;
  value_type in_stack_fffffffffffffc58;
  double upper_00;
  string *lower_00;
  string *this;
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [38];
  byte local_282;
  allocator local_281;
  string local_280 [32];
  string local_260 [36];
  uint local_23c;
  string local_238 [32];
  string local_218 [55];
  allocator local_1e1;
  string local_1e0 [32];
  stringstream local_1c0 [16];
  ostream local_1b0;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  vector<double,_std::allocator<double>_> *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  int local_20;
  byte local_19;
  string *local_18;
  double local_10;
  
  local_19 = in_DL & 1;
  local_31 = in_stack_00000010 & 1;
  local_32 = in_stack_00000020 & 1;
  local_33 = in_stack_00000030 & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_stack_00000008);
  local_34 = sVar2 != 0;
  local_35 = in_stack_00000040 != 0;
  std::__cxx11::stringstream::stringstream(local_1c0);
  pcVar3 = "Rows\n";
  if ((local_19 & 1) != 0) {
    pcVar3 = "Columns\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,pcVar3,&local_1e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  highsFprintfString(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  this = local_218;
  std::__cxx11::string::string(this);
  std::__cxx11::stringstream::str((string *)local_1c0);
  std::__cxx11::string::~string(local_218);
  std::operator<<(&local_1b0,"    Index Status        Lower        Upper       Primal         Dual")
  ;
  if ((local_35 & 1) != 0) {
    std::operator<<(&local_1b0,"  Type      ");
  }
  if ((local_34 & 1) == 0) {
    std::operator<<(&local_1b0,"\n");
  }
  else {
    std::operator<<(&local_1b0,"  Name\n");
  }
  lower_00 = local_18;
  std::__cxx11::stringstream::str();
  highsFprintfString(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(local_238);
  upper_00 = local_10;
  for (local_23c = 0; (int)local_23c < local_20; local_23c = local_23c + 1) {
    std::__cxx11::string::string(local_260);
    std::__cxx11::stringstream::str((string *)local_1c0);
    std::__cxx11::string::~string(local_260);
    local_282 = 0;
    if ((local_33 & 1) == 0) {
      std::allocator<char>::allocator();
      local_282 = 1;
      std::__cxx11::string::string(local_280,"",&local_281);
    }
    else {
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                (in_stack_00000038,(long)(int)local_23c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_28,(long)(int)local_23c);
      in_stack_fffffffffffffc58 = *pvVar4;
      std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)(int)local_23c);
      statusToString_abi_cxx11_((HighsBasisStatus)((ulong)this >> 0x38),(double)lower_00,upper_00);
    }
    if ((local_282 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
    }
    uVar1 = local_23c;
    uVar5 = std::__cxx11::string::c_str();
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)(int)local_23c)
    ;
    pcVar3 = (char *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)(int)local_23c)
    ;
    highsFormatToString_abi_cxx11_
              (pcVar3,*pvVar4,local_2a8,"%9d   %4s %12g %12g",(ulong)uVar1,uVar5);
    std::operator<<(&local_1b0,local_2a8);
    std::__cxx11::string::~string(local_2a8);
    if ((local_31 & 1) == 0) {
      std::operator<<(&local_1b0,"             ");
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000018,(long)(int)local_23c);
      highsFormatToString_abi_cxx11_((char *)*pvVar4,local_2c8," %12g");
      std::operator<<(&local_1b0,local_2c8);
      std::__cxx11::string::~string(local_2c8);
    }
    if ((local_32 & 1) == 0) {
      std::operator<<(&local_1b0,"             ");
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000028,(long)(int)local_23c);
      highsFormatToString_abi_cxx11_((char *)*pvVar4,local_2e8," %12g");
      std::operator<<(&local_1b0,local_2e8);
      std::__cxx11::string::~string(local_2e8);
    }
    if ((local_35 & 1) != 0) {
      in_stack_fffffffffffffc10 = (FILE *)&local_1b0;
      typeToString_abi_cxx11_((HighsVarType)((ulong)in_stack_fffffffffffffc58 >> 0x38));
      uVar5 = std::__cxx11::string::c_str();
      highsFormatToString_abi_cxx11_((char *)local_308,"  %s",uVar5);
      std::operator<<((ostream *)in_stack_fffffffffffffc10,local_308);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_328);
    }
    if ((local_34 & 1) == 0) {
      std::operator<<(&local_1b0,"\n");
    }
    else {
      in_stack_fffffffffffffc08 = (HighsLogOptions *)&local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_stack_00000008,(long)(int)local_23c);
      uVar5 = std::__cxx11::string::c_str();
      highsFormatToString_abi_cxx11_((char *)local_348,"  %-s\n",uVar5);
      std::operator<<((ostream *)in_stack_fffffffffffffc08,local_348);
      std::__cxx11::string::~string(local_348);
    }
    s_00 = local_18;
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,s_00);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_280);
  }
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void writeModelBoundSolution(
    FILE* file, const HighsLogOptions& log_options, const bool columns,
    const HighsInt dim, const std::vector<double>& lower,
    const std::vector<double>& upper, const std::vector<std::string>& names,
    const bool have_primal, const std::vector<double>& primal,
    const bool have_dual, const std::vector<double>& dual,
    const bool have_basis, const std::vector<HighsBasisStatus>& status,
    const HighsVarType* integrality) {
  const bool have_names = names.size() > 0;
  if (have_names) assert((int)names.size() >= dim);
  if (have_primal) assert((int)primal.size() >= dim);
  if (have_dual) assert((int)dual.size() >= dim);
  if (have_basis) assert((int)status.size() >= dim);
  const bool have_integrality = integrality != NULL;
  std::stringstream ss;
  std::string s = columns ? "Columns\n" : "Rows\n";
  highsFprintfString(file, log_options, s);
  ss.str(std::string());
  ss << "    Index Status        Lower        Upper       Primal         Dual";
  if (have_integrality) ss << "  Type      ";
  if (have_names) {
    ss << "  Name\n";
  } else {
    ss << "\n";
  }
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < dim; ix++) {
    ss.str(std::string());
    std::string var_status_string =
        have_basis ? statusToString(status[ix], lower[ix], upper[ix]) : "";
    ss << highsFormatToString("%9" HIGHSINT_FORMAT "   %4s %12g %12g", ix,
                              var_status_string.c_str(), lower[ix], upper[ix]);
    if (have_primal) {
      ss << highsFormatToString(" %12g", primal[ix]);
    } else {
      ss << "             ";
    }
    if (have_dual) {
      ss << highsFormatToString(" %12g", dual[ix]);
    } else {
      ss << "             ";
    }
    if (have_integrality)
      ss << highsFormatToString("  %s", typeToString(integrality[ix]).c_str());
    if (have_names) {
      ss << highsFormatToString("  %-s\n", names[ix].c_str());
    } else {
      ss << "\n";
    }
    highsFprintfString(file, log_options, ss.str());
  }
}